

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::StartElement(cmXMLWriter *this,string *name)

{
  ostream *poVar1;
  
  CloseStartElement(this);
  ConditionalLineBreak
            (this,(bool)(this->IsContent ^ 1),
             (long)(this->Elements).c.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Elements).c.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  poVar1 = std::operator<<(this->Output,'<');
  std::operator<<(poVar1,(string *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->Elements).c,name);
  this->ElementOpen = true;
  this->BreakAttrib = false;
  return;
}

Assistant:

void cmXMLWriter::StartElement(std::string const& name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent, this->Elements.size());
  this->Output << '<' << name;
  this->Elements.push(name);
  this->ElementOpen = true;
  this->BreakAttrib = false;
}